

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O1

void __thiscall PlayerStrategy::PlayerStrategy(PlayerStrategy *this,PlayerStrategy *toCopy)

{
  string *psVar1;
  pointer pcVar2;
  int *piVar3;
  string *psVar4;
  
  this->_vptr_PlayerStrategy = (_func_int **)&PTR___cxa_pure_virtual_0013c8c8;
  piVar3 = (int *)operator_new(4);
  *piVar3 = -1;
  this->numWeakest = piVar3;
  this->exchangingCardType = toCopy->exchangingCardType;
  this->armiesToPlace = toCopy->armiesToPlace;
  this->player = toCopy->player;
  this->from = toCopy->from;
  this->to = toCopy->to;
  psVar4 = (string *)operator_new(0x20);
  psVar1 = toCopy->strategyName;
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  pcVar2 = (psVar1->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar4,pcVar2,pcVar2 + psVar1->_M_string_length);
  this->strategyName = psVar4;
  return;
}

Assistant:

PlayerStrategy::PlayerStrategy(const PlayerStrategy& toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string(toCopy.getStrategyName());
}